

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O0

int lwsl_timestamp(int level,char *p,int len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  tm *ptVar3;
  int local_94;
  undefined1 local_90 [4];
  int n;
  tm tm;
  tm *ptm;
  timeval tv;
  unsigned_long_long now;
  time_t o_now;
  char *pcStack_28;
  int len_local;
  char *p_local;
  int level_local;
  
  tm.tm_zone = (char *)0x0;
  o_now._4_4_ = len;
  pcStack_28 = p;
  p_local._0_4_ = level;
  gettimeofday((timeval *)&ptm,(__timezone_ptr_t)0x0);
  now = (unsigned_long_long)ptm;
  tv.tv_usec = (long)ptm * 10000 + tv.tv_sec / 100;
  ptVar3 = localtime_r((time_t *)&now,(tm *)local_90);
  if (ptVar3 != (tm *)0x0) {
    tm.tm_zone = local_90;
  }
  *pcStack_28 = '\0';
  local_94 = 0;
  while( true ) {
    if (0xb < local_94) {
      return 0;
    }
    if ((int)p_local == 1 << ((byte)local_94 & 0x1f)) break;
    local_94 = local_94 + 1;
  }
  if (tm.tm_zone == (char *)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = tv.tv_usec;
    local_94 = lws_snprintf(pcStack_28,(long)o_now._4_4_,"[%llu:%04d] %s: ",
                            (ulong)tv.tv_usec / 10000,(ulong)SUB164(auVar1 % ZEXT816(10000),0),
                            log_level_names[local_94]);
  }
  else {
    auVar2._8_4_ = 0;
    auVar2._0_8_ = tv.tv_usec;
    local_94 = lws_snprintf(pcStack_28,(long)o_now._4_4_,"[%04d/%02d/%02d %02d:%02d:%02d:%04d] %s: "
                            ,(ulong)(*(int *)(tm.tm_zone + 0x14) + 0x76c),
                            (ulong)(*(int *)(tm.tm_zone + 0x10) + 1),
                            (ulong)*(uint *)(tm.tm_zone + 0xc),*(undefined4 *)(tm.tm_zone + 8),
                            *(undefined4 *)(tm.tm_zone + 4),*(undefined4 *)tm.tm_zone,
                            SUB124(auVar2 % ZEXT812(10000),0),log_level_names[local_94]);
  }
  return local_94;
}

Assistant:

int
lwsl_timestamp(int level, char *p, int len)
{
#ifndef LWS_PLAT_OPTEE
	time_t o_now;
	unsigned long long now;
	struct timeval tv;
	struct tm *ptm = NULL;
#ifndef WIN32
	struct tm tm;
#endif
	int n;

	gettimeofday(&tv, NULL);
	o_now = tv.tv_sec;
	now = ((unsigned long long)tv.tv_sec * 10000) + (tv.tv_usec / 100);

#ifndef _WIN32_WCE
#ifdef WIN32
	ptm = localtime(&o_now);
#else
	if (localtime_r(&o_now, &tm))
		ptm = &tm;
#endif
#endif
	p[0] = '\0';
	for (n = 0; n < LLL_COUNT; n++) {
		if (level != (1 << n))
			continue;

		if (ptm)
			n = lws_snprintf(p, len,
				"[%04d/%02d/%02d %02d:%02d:%02d:%04d] %s: ",
				ptm->tm_year + 1900,
				ptm->tm_mon + 1,
				ptm->tm_mday,
				ptm->tm_hour,
				ptm->tm_min,
				ptm->tm_sec,
				(int)(now % 10000), log_level_names[n]);
		else
			n = lws_snprintf(p, len, "[%llu:%04d] %s: ",
					(unsigned long long) now / 10000,
					(int)(now % 10000), log_level_names[n]);
		return n;
	}
#else
	p[0] = '\0';
#endif

	return 0;
}